

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Vector.H
# Opt level: O1

Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *
amrex::GetVecOfPtrs<amrex::MultiFab>
          (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *__return_storage_ptr__,
          Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          *a)

{
  pointer *pppMVar1;
  pointer puVar2;
  iterator __position;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *x;
  pointer puVar3;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_28;
  
  (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::reserve
            (&__return_storage_ptr__->
              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
             (long)(a->
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(a->
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (a->
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (a->
                super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ).
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    local_28._M_head_impl =
         (puVar3->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    __position._M_current =
         (__return_storage_ptr__->
         super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
        ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
      _M_realloc_insert<amrex::MultiFab*>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)__return_storage_ptr__
                 ,__position,&local_28._M_head_impl);
    }
    else {
      *__position._M_current = local_28._M_head_impl;
      pppMVar1 = &(__return_storage_ptr__->
                  super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<T*> GetVecOfPtrs (const Vector<std::unique_ptr<T> >& a)
    {
        Vector<T*> r;
        r.reserve(a.size());
        for (const auto& x : a)  r.push_back(x.get());
        return r;
    }